

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O1

VarnodeTpl * __thiscall EndSymbol::getVarnode(EndSymbol *this)

{
  VarnodeTpl *this_00;
  ConstTpl sz_zero;
  ConstTpl off;
  ConstTpl spc;
  ConstTpl local_80;
  ConstTpl local_60;
  ConstTpl local_40;
  
  ConstTpl::ConstTpl(&local_40,this->const_space);
  ConstTpl::ConstTpl(&local_60,j_next);
  local_80.type = real;
  local_80.value_real = 0;
  this_00 = (VarnodeTpl *)operator_new(0x68);
  VarnodeTpl::VarnodeTpl(this_00,&local_40,&local_60,&local_80);
  return this_00;
}

Assistant:

VarnodeTpl *EndSymbol::getVarnode(void) const

{ // Return next instruction offset as a constant
  ConstTpl spc(const_space);
  ConstTpl off(ConstTpl::j_next);
  ConstTpl sz_zero;
  return new VarnodeTpl(spc,off,sz_zero);
}